

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

void Bt3_MatchFinder_Skip(CMatchFinder *p,UInt32 num)

{
  uint lenLimit;
  CLzRef CVar1;
  byte *cur;
  CLzRef *pCVar2;
  uint uVar3;
  UInt32 UVar4;
  uint uVar5;
  
  do {
    lenLimit = p->lenLimit;
    if (lenLimit < 3) {
      MatchFinder_MovePos(p);
    }
    else {
      cur = p->buffer;
      uVar5 = (uint)cur[1] ^ p->crc[*cur];
      pCVar2 = p->hash;
      uVar3 = (((uint)cur[2] << 8 ^ uVar5) & p->hashMask) + 0x400;
      UVar4 = pCVar2[uVar3];
      CVar1 = p->pos;
      pCVar2[uVar3] = CVar1;
      pCVar2[uVar5 & 0x3ff] = CVar1;
      SkipMatchesSpec(lenLimit,UVar4,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                      p->cutValue);
      p->cyclicBufferPos = p->cyclicBufferPos + 1;
      p->buffer = p->buffer + 1;
      UVar4 = p->pos + 1;
      p->pos = UVar4;
      if (UVar4 == p->posLimit) {
        MatchFinder_CheckLimits(p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

static void Bt3_MatchFinder_Skip(CMatchFinder *p, UInt32 num)
{
  do
  {
    UInt32 h2;
    UInt32 *hash;
    SKIP_HEADER(3)
    HASH3_CALC;
    hash = p->hash;
    curMatch = hash[kFix3HashSize + hv];
    hash[h2] =
    hash[kFix3HashSize + hv] = p->pos;
    SKIP_FOOTER
  }
  while (--num != 0);
}